

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

ostream * el::base::debug::operator<<(ostream *ss,StackTraceEntry *si)

{
  ostream *poVar1;
  char *pcVar2;
  bool bVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ss,"[",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)ss);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(si->m_location)._M_dataplus._M_p,(si->m_location)._M_string_length);
  bVar3 = (si->m_demangled)._M_string_length != 0;
  pcVar2 = ":";
  if (!bVar3) {
    pcVar2 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,(ulong)bVar3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(si->m_demangled)._M_dataplus._M_p,(si->m_demangled)._M_string_length);
  bVar3 = (si->m_hex)._M_string_length != 0;
  pcVar2 = "+";
  if (!bVar3) {
    pcVar2 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,(ulong)bVar3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(si->m_hex)._M_dataplus._M_p,(si->m_hex)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(si->m_addr)._M_dataplus._M_p,(si->m_addr)._M_string_length);
  return ss;
}

Assistant:

std::ostream& operator<<(std::ostream& ss, const StackTrace::StackTraceEntry& si) {
  ss << "[" << si.m_index << "] " << si.m_location << (si.m_demangled.empty() ? "" : ":") << si.m_demangled
     << (si.m_hex.empty() ? "" : "+") << si.m_hex << si.m_addr;
  return ss;
}